

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_test.cpp
# Opt level: O1

void __thiscall
check_computations_of_values_on_different_points::test_method
          (check_computations_of_values_on_different_points *this)

{
  double dVar1;
  Persistence_landscape p;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> diag;
  undefined1 local_50 [40];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_28;
  
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"data/file_with_diagram","");
  Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
            (&local_28,(string *)local_50,-1,-1.0);
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)local_50,&local_28,0xffffffffffffffff);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,1,0.0);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.0,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,1,0.1);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.0692324,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,1,0.2);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.163369,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,1,0.3);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.217115,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,2,0.0);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.0,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,2,0.1);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.0633688,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,2,0.2);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.122361,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,2,0.3);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.195401,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,3,0.0);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.0,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,3,0.1);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.0455386,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,3,0.2);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.0954012,epsilon);
  dVar1 = Gudhi::Persistence_representations::Persistence_landscape::compute_value_at_a_given_point
                    ((Persistence_landscape *)local_50,3,0.3);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.185282,epsilon);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             *)local_50);
  if (local_28.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_computations_of_distances) {
  std::vector<std::pair<double, double> > diag =
      read_persistence_intervals_in_one_dimension_from_file("data/file_with_diagram");
  Persistence_landscape p(diag);
  std::vector<std::pair<double, double> > diag2 =
      read_persistence_intervals_in_one_dimension_from_file("data/file_with_diagram_1");
  Persistence_landscape q(diag2);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q), 25.5824, epsilon);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q, 2), 2.1264, epsilon);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q, std::numeric_limits<double>::max()), 0.359068, epsilon);
}